

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBinFromStdio::load(ModelBinFromStdio *this,int w,int type)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_short *__ptr;
  char *pcVar4;
  void *pvVar5;
  uchar *__ptr_00;
  byte *pbVar6;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  Mat *in_RDI;
  int nread_1;
  Mat m_3;
  int i;
  float *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  int align_weight_data_size;
  float quantization_value [256];
  Mat m;
  Mat m_2;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  int align_data_size_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  int align_data_size;
  uint flag;
  anon_union_4_2_77b30072 flag_struct;
  int nread;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff9b8;
  Mat *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  int _w;
  Mat *in_stack_fffffffffffff9d0;
  undefined7 in_stack_fffffffffffff9d8;
  undefined1 in_stack_fffffffffffff9df;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9f0;
  int size;
  unsigned_short *in_stack_fffffffffffff9f8;
  Mat local_568;
  int local_524;
  float *local_520;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_518;
  int local_4fc;
  float local_4f8 [256];
  Mat local_f8;
  Mat local_b8;
  undefined1 local_71;
  int local_54;
  int local_50;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int local_14;
  
  size = (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20);
  _w = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
  if (*(long *)(in_RSI + 8) == 0) {
    Mat::Mat(in_RDI);
    return in_RDI;
  }
  local_14 = in_EDX;
  if (in_ECX != 0) {
    if (in_ECX == 1) {
      Mat::Mat(&local_568,_w,(size_t)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
      if (bVar1) {
        Mat::Mat(in_RDI,&local_568);
      }
      else {
        pvVar5 = Mat::operator_cast_to_void_(&local_568);
        sVar2 = fread(pvVar5,(long)local_14 << 2,1,*(FILE **)(in_RSI + 8));
        if ((int)sVar2 == 1) {
          Mat::Mat(in_RDI,&local_568);
        }
        else {
          fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar2 & 0xffffffff);
          Mat::Mat(in_RDI);
        }
      }
      local_50 = 1;
      Mat::~Mat((Mat *)0x124fc4);
      return in_RDI;
    }
    fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)in_ECX);
    Mat::Mat(in_RDI);
    return in_RDI;
  }
  sVar2 = fread(&local_20,4,1,*(FILE **)(in_RSI + 8));
  local_1c = (int)sVar2;
  if (local_1c != 1) {
    fprintf(_stderr,"ModelBin read flag_struct failed %d\n",sVar2 & 0xffffffff);
    Mat::Mat(in_RDI);
    return in_RDI;
  }
  local_24 = (local_20 & 0xff) + (local_20 >> 8 & 0xff) + (local_20 >> 0x10 & 0xff) +
             (local_20 >> 0x18);
  if (local_20 == 0x1306b47) {
    sVar3 = ncnn::alignSize((long)local_14 * 2,4);
    local_28 = (int)sVar3;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x124643);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffff9e0,
               CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
    __ptr = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x124667);
    sVar2 = fread(__ptr,(long)local_28,1,*(FILE **)(in_RSI + 8));
    local_1c = (int)sVar2;
    if (local_1c == 1) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x124719);
      Mat::from_float16(in_stack_fffffffffffff9f8,size);
    }
    else {
      fprintf(_stderr,"ModelBin read float16_weights failed %d\n",sVar2 & 0xffffffff);
      Mat::Mat(in_RDI);
    }
    local_50 = 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffff9d0)
    ;
    return in_RDI;
  }
  if (local_20 == 0xd4b38) {
    sVar3 = ncnn::alignSize((long)local_14,4);
    local_54 = (int)sVar3;
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x12478e);
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              (in_stack_fffffffffffff9e0,
               CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
    pcVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x1247b2);
    sVar2 = fread(pcVar4,(long)local_54,1,*(FILE **)(in_RSI + 8));
    local_1c = (int)sVar2;
    if (local_1c == 1) {
      local_71 = 0;
      Mat::Mat(in_stack_fffffffffffff9d0,_w,(size_t)in_stack_fffffffffffff9c0,
               in_stack_fffffffffffff9b8);
      bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
      if (!bVar1) {
        pvVar5 = in_RDI->data;
        pcVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                           ((vector<signed_char,_std::allocator<signed_char>_> *)0x1248ef);
        memcpy(pvVar5,pcVar4,(long)local_14);
      }
      local_71 = 1;
    }
    else {
      fprintf(_stderr,"ModelBin read int8_weights failed %d\n",sVar2 & 0xffffffff);
      Mat::Mat(in_RDI);
    }
    local_50 = 1;
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffff9d0);
    return in_RDI;
  }
  if (local_20 == 0x2c056) {
    Mat::Mat(in_stack_fffffffffffff9d0,_w,(size_t)in_stack_fffffffffffff9c0,
             in_stack_fffffffffffff9b8);
    bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
    if (bVar1) {
      Mat::Mat(in_RDI,&local_b8);
    }
    else {
      pvVar5 = Mat::operator_cast_to_void_(&local_b8);
      sVar2 = fread(pvVar5,(long)local_14 << 2,1,*(FILE **)(in_RSI + 8));
      local_1c = (int)sVar2;
      if (local_1c == 1) {
        Mat::Mat(in_RDI,&local_b8);
      }
      else {
        fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar2 & 0xffffffff);
        Mat::Mat(in_RDI);
      }
    }
    local_50 = 1;
    Mat::~Mat((Mat *)0x124abf);
    return in_RDI;
  }
  Mat::Mat(in_stack_fffffffffffff9d0,_w,(size_t)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8)
  ;
  bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
  if (bVar1) {
    Mat::Mat(in_RDI,&local_f8);
    local_50 = 1;
    goto LAB_00124e47;
  }
  if (local_24 == 0) {
    if ((char)local_20 == '\0') {
      pvVar5 = Mat::operator_cast_to_void_(&local_f8);
      sVar2 = fread(pvVar5,(long)local_14 << 2,1,*(FILE **)(in_RSI + 8));
      local_1c = (int)sVar2;
      if (local_1c != 1) {
        fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar2 & 0xffffffff);
        Mat::Mat(in_RDI);
        local_50 = 1;
        goto LAB_00124e47;
      }
    }
  }
  else {
    sVar2 = fread(local_4f8,0x400,1,*(FILE **)(in_RSI + 8));
    local_1c = (int)sVar2;
    if (local_1c != 1) {
      fprintf(_stderr,"ModelBin read quantization_value failed %d\n",sVar2 & 0xffffffff);
      Mat::Mat(in_RDI);
      local_50 = 1;
      goto LAB_00124e47;
    }
    sVar3 = ncnn::alignSize((long)local_14,4);
    local_4fc = (int)sVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x124c07);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9e0,
               CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
    __ptr_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x124c28);
    sVar2 = fread(__ptr_00,(long)local_4fc,1,*(FILE **)(in_RSI + 8));
    local_1c = (int)sVar2;
    if (local_1c == 1) {
      local_520 = Mat::operator_cast_to_float_(&local_f8);
      for (local_524 = 0; local_524 < local_14; local_524 = local_524 + 1) {
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&local_518,(long)local_524);
        local_520[local_524] = local_4f8[*pbVar6];
      }
      local_50 = 0;
    }
    else {
      fprintf(_stderr,"ModelBin read index_array failed %d\n",sVar2 & 0xffffffff);
      Mat::Mat(in_RDI);
      local_50 = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9d0);
    if (local_50 != 0) goto LAB_00124e47;
  }
  Mat::Mat(in_RDI,&local_f8);
  local_50 = 1;
LAB_00124e47:
  Mat::~Mat((Mat *)0x124e54);
  return in_RDI;
}

Assistant:

Mat ModelBinFromStdio::load(int w, int type) const
{
    if (!binfp)
        return Mat();

    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = fread(&flag_struct, sizeof(flag_struct), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = fread(float16_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = fread(int8_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = fread(quantization_value, 256 * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = fread(index_array.data(), align_weight_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = fread(m, w * sizeof(float), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}